

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O2

Index __thiscall
wasm::anon_unknown_21::RedundantSetElimination::getValue
          (RedundantSetElimination *this,Expression *expr,LocalValues *currValues)

{
  Index IVar1;
  
  if (expr->_id == LocalGetId) {
    return (currValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[*(uint *)(expr + 1)];
  }
  IVar1 = ValueNumbering::getValue(&this->valueNumbering,expr);
  return IVar1;
}

Assistant:

Index getValue(Expression* expr, LocalValues& currValues) {
    if (auto* get = expr->dynCast<LocalGet>()) {
      // a copy of whatever that was
      return currValues[get->index];
    }
    auto value = valueNumbering.getValue(expr);
#ifdef RSE_DEBUG
    std::cout << "expr value " << value << '\n';
#endif
    return value;
  }